

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ZSTD_compressionParameters cParams;
  uint uVar1;
  void *src_00;
  ZSTD_CCtx *in_RCX;
  ZSTD_CCtx_params *in_RDX;
  size_t in_RDI;
  void *in_R8;
  undefined8 in_R9;
  size_t err_code;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 *srcSize_00;
  undefined8 in_stack_ffffffffffffffc0;
  ZSTD_strategy ZVar2;
  undefined4 uVar3;
  ZSTD_CCtx_params *in_stack_fffffffffffffff8;
  
  srcSize_00 = &stack0x00000010;
  ZVar2 = (ZSTD_strategy)in_R9;
  uVar3 = (undefined4)((ulong)in_R9 >> 0x20);
  cParams.chainLog = in_stack_ffffffffffffffb4;
  cParams.windowLog = (undefined4)err_code;
  cParams._8_8_ = srcSize_00;
  cParams._16_8_ = in_stack_ffffffffffffffc0;
  cParams.strategy = ZVar2;
  src_00 = (void *)ZSTD_checkCParams(cParams);
  uVar1 = ERR_isError((size_t)src_00);
  if (uVar1 == 0) {
    ZSTD_CCtxParams_init_internal(in_RDX,(ZSTD_parameters *)in_RCX,(int)((ulong)in_R8 >> 0x20));
    src_00 = (void *)ZSTD_compress_advanced_internal
                               (in_RCX,in_R8,CONCAT44(uVar3,ZVar2),src_00,(size_t)srcSize_00,
                                (void *)CONCAT44(in_stack_ffffffffffffffb4,(undefined4)err_code),
                                in_RDI,in_stack_fffffffffffffff8);
  }
  return (size_t)src_00;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, ZSTD_NO_CLEVEL);
    return ZSTD_compress_advanced_internal(cctx,
                                           dst, dstCapacity,
                                           src, srcSize,
                                           dict, dictSize,
                                           &cctx->simpleApiParams);
}